

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

double Logger::log(double __x)

{
  _Setw _Var1;
  ostream *poVar2;
  int in_EDI;
  double dVar3;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  ostream *os;
  allocator<char> local_31;
  string local_30 [8];
  string label;
  Type level_local;
  
  if (in_EDI == 0) {
    local_60 = "FATAL";
  }
  else {
    if (in_EDI == 1) {
      local_68 = "ERROR";
    }
    else {
      if (in_EDI == 2) {
        local_70 = "WARNING";
      }
      else {
        if (in_EDI == 3) {
          local_78 = "INFO";
        }
        else {
          local_78 = "DETAIL";
          if (in_EDI == 4) {
            local_78 = "DEBUG";
          }
        }
        local_70 = local_78;
      }
      local_68 = local_70;
    }
    local_60 = local_68;
  }
  label.field_2._12_4_ = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,local_60,&local_31);
  std::allocator<char>::~allocator(&local_31);
  poVar2 = (ostream *)&std::cout;
  if ((int)label.field_2._12_4_ < 3) {
    poVar2 = (ostream *)&std::cerr;
  }
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  _Var1 = std::setw(7);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<(poVar2,local_30);
  std::operator<<(poVar2,": ");
  dVar3 = (double)std::__cxx11::string::~string(local_30);
  return dVar3;
}

Assistant:

static std::ostream & log(Logger::Level::Type level)
    {
        std::string label = (level==Logger::Level::FATAL  ? "FATAL":
                            (level==Logger::Level::ERROR  ? "ERROR":
                            (level==Logger::Level::WARNING? "WARNING":
                            (level==Logger::Level::INFO   ? "INFO":
                            (level==Logger::Level::DEBUG  ? "DEBUG":"DETAIL")))));
        std::ostream * os = (level <= Logger::Level::WARNING ? &std::cerr : &std::cout);
        *os << std::left << std::setw(7) << label << ": ";
        return *os;
    }